

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O0

void __thiscall
FTextureManager::AddTexturesLumps(FTextureManager *this,int lump1,int lump2,int patcheslump)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_40 [8];
  FMemLump texdir_1;
  undefined1 local_28 [8];
  FMemLump texdir;
  int firstdup;
  int patcheslump_local;
  int lump2_local;
  int lump1_local;
  FTextureManager *this_local;
  
  texdir.Block.Chars._4_4_ = patcheslump;
  texdir.Block.Chars._0_4_ =
       TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Size(&this->Textures);
  if (-1 < lump1) {
    FWadCollection::ReadLump((FWadCollection *)local_28,0xdb0460);
    pvVar2 = FMemLump::GetMem((FMemLump *)local_28);
    iVar1 = FWadCollection::LumpLength(&Wads,lump1);
    AddTexturesLump(this,pvVar2,iVar1,lump1,texdir.Block.Chars._4_4_,(uint)texdir.Block.Chars,true);
    FMemLump::~FMemLump((FMemLump *)local_28);
  }
  if (-1 < lump2) {
    FWadCollection::ReadLump((FWadCollection *)local_40,0xdb0460);
    pvVar2 = FMemLump::GetMem((FMemLump *)local_40);
    iVar1 = FWadCollection::LumpLength(&Wads,lump2);
    AddTexturesLump(this,pvVar2,iVar1,lump2,texdir.Block.Chars._4_4_,(uint)texdir.Block.Chars,false)
    ;
    FMemLump::~FMemLump((FMemLump *)local_40);
  }
  return;
}

Assistant:

void FTextureManager::AddTexturesLumps (int lump1, int lump2, int patcheslump)
{
	int firstdup = (int)Textures.Size();

	if (lump1 >= 0)
	{
		FMemLump texdir = Wads.ReadLump (lump1);
		AddTexturesLump (texdir.GetMem(), Wads.LumpLength (lump1), lump1, patcheslump, firstdup, true);
	}
	if (lump2 >= 0)
	{
		FMemLump texdir = Wads.ReadLump (lump2);
		AddTexturesLump (texdir.GetMem(), Wads.LumpLength (lump2), lump2, patcheslump, firstdup, false);
	}
}